

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int evthread_make_base_notifiable_nolock_(event_base *base)

{
  int iVar1;
  _func_int_event_base_ptr *local_28;
  _func_int_event_base_ptr *notify;
  _func_void_int_short_void_ptr *cb;
  event_base *base_local;
  
  if (base->th_notify_fn == (_func_int_event_base_ptr *)0x0) {
    iVar1 = evutil_eventfd_(0,0x80800);
    base->th_notify_fd[0] = iVar1;
    if (base->th_notify_fd[0] < 0) {
      iVar1 = evutil_make_internal_pipe_(base->th_notify_fd);
      if (iVar1 != 0) {
        return -1;
      }
      local_28 = evthread_notify_base_default;
      notify = evthread_notify_drain_default;
    }
    else {
      base->th_notify_fd[1] = -1;
      local_28 = evthread_notify_base_eventfd;
      notify = evthread_notify_drain_eventfd;
    }
    base->th_notify_fn = local_28;
    event_assign(&base->th_notify,base,base->th_notify_fd[0],0x12,
                 (_func_void_int_short_void_ptr *)notify,base);
    (base->th_notify).ev_evcallback.evcb_flags = (base->th_notify).ev_evcallback.evcb_flags | 0x10;
    event_priority_set(&base->th_notify,0);
    base_local._4_4_ = event_add_nolock_(&base->th_notify,(timeval *)0x0,0);
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

static int
evthread_make_base_notifiable_nolock_(struct event_base *base)
{
	void (*cb)(evutil_socket_t, short, void *);
	int (*notify)(struct event_base *);

	if (base->th_notify_fn != NULL) {
		/* The base is already notifiable: we're doing fine. */
		return 0;
	}

#if defined(EVENT__HAVE_WORKING_KQUEUE)
	if (base->evsel == &kqops && event_kq_add_notify_event_(base) == 0) {
		base->th_notify_fn = event_kq_notify_base_;
		/* No need to add an event here; the backend can wake
		 * itself up just fine. */
		return 0;
	}
#endif

#ifdef EVENT__HAVE_EVENTFD
	base->th_notify_fd[0] = evutil_eventfd_(0,
	    EVUTIL_EFD_CLOEXEC|EVUTIL_EFD_NONBLOCK);
	if (base->th_notify_fd[0] >= 0) {
		base->th_notify_fd[1] = -1;
		notify = evthread_notify_base_eventfd;
		cb = evthread_notify_drain_eventfd;
	} else
#endif
	if (evutil_make_internal_pipe_(base->th_notify_fd) == 0) {
		notify = evthread_notify_base_default;
		cb = evthread_notify_drain_default;
	} else {
		return -1;
	}

	base->th_notify_fn = notify;

	/* prepare an event that we can use for wakeup */
	event_assign(&base->th_notify, base, base->th_notify_fd[0],
				 EV_READ|EV_PERSIST, cb, base);

	/* we need to mark this as internal event */
	base->th_notify.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&base->th_notify, 0);

	return event_add_nolock_(&base->th_notify, NULL, 0);
}